

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_debug_pred_weight_table(h264_stream_t *h,bs_t *b)

{
  slice_header_t *psVar1;
  sps_t *psVar2;
  pps_t *ppVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  FILE *pFVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  psVar1 = h->sh;
  psVar2 = h->sps;
  ppVar3 = h->pps;
  iVar10 = 0;
  fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar8 = b->p;
  pbVar4 = b->end;
  uVar11 = b->bits_left;
  uVar5 = 0xffffffff;
  do {
    uVar11 = uVar11 - 1;
    b->bits_left = uVar11;
    bVar19 = true;
    if (pbVar8 < pbVar4) {
      bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
    }
    if (uVar11 == 0) {
      pbVar8 = pbVar8 + 1;
      b->p = pbVar8;
      b->bits_left = 8;
      uVar11 = 8;
    }
    uVar5 = uVar5 + 1;
    iVar10 = iVar10 + -1;
  } while (((bool)(bVar19 & uVar5 < 0x20)) && (pbVar8 < pbVar4));
  if (iVar10 == -1) {
    uVar5 = 0;
  }
  else {
    iVar6 = -2 - iVar10;
    iVar13 = -3 - iVar10;
    uVar5 = 0;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      uVar7 = 0;
      if (pbVar8 < pbVar4) {
        uVar7 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        pbVar8 = pbVar8 + 1;
        b->p = pbVar8;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar5 = uVar5 | uVar7 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  (psVar1->pwt).luma_log2_weight_denom = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar5;
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  fprintf(pFVar12,"sh->pwt.luma_log2_weight_denom: %d \n");
  if (psVar2->chroma_format_idc != 0) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    iVar10 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar8 = b->p;
    pbVar4 = b->end;
    uVar11 = b->bits_left;
    uVar5 = 0xffffffff;
    do {
      uVar11 = uVar11 - 1;
      b->bits_left = uVar11;
      bVar19 = true;
      if (pbVar8 < pbVar4) {
        bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
      }
      if (uVar11 == 0) {
        pbVar8 = pbVar8 + 1;
        b->p = pbVar8;
        b->bits_left = 8;
        uVar11 = 8;
      }
      uVar5 = uVar5 + 1;
      iVar10 = iVar10 + -1;
    } while (((bool)(bVar19 & uVar5 < 0x20)) && (pbVar8 < pbVar4));
    if (iVar10 == -1) {
      uVar5 = 0;
    }
    else {
      iVar6 = -2 - iVar10;
      iVar13 = -3 - iVar10;
      uVar5 = 0;
      do {
        uVar11 = uVar11 - 1;
        b->bits_left = uVar11;
        uVar7 = 0;
        if (pbVar8 < pbVar4) {
          uVar7 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
        }
        if (uVar11 == 0) {
          pbVar8 = pbVar8 + 1;
          b->p = pbVar8;
          b->bits_left = 8;
          uVar11 = 8;
        }
        uVar5 = uVar5 | uVar7 << ((byte)iVar6 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar13 != -2);
    }
    (psVar1->pwt).chroma_log2_weight_denom = ~(-1 << (~(byte)iVar10 & 0x1f)) + uVar5;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->pwt.chroma_log2_weight_denom: %d \n");
  }
  if (-1 < ppVar3->num_ref_idx_l0_active_minus1) {
    lVar18 = 0;
    do {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      uVar16 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar11 = b->bits_left - 1;
      b->bits_left = uVar11;
      pbVar8 = b->p;
      if (pbVar8 < b->end) {
        uVar16 = (ulong)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        b->p = pbVar8 + 1;
        b->bits_left = 8;
      }
      (psVar1->pwt).luma_weight_l0_flag[lVar18] = (int)uVar16;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->pwt.luma_weight_l0_flag[i]: %d \n",uVar16);
      if ((psVar1->pwt).luma_weight_l0_flag[lVar18] != 0) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar8 = b->p;
        pbVar4 = b->end;
        uVar11 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar10 = -2;
        do {
          iVar6 = iVar10;
          uVar7 = uVar5;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar19 = true;
          if (pbVar8 < pbVar4) {
            bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar8 = pbVar8 + 1;
            b->p = pbVar8;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar5 = uVar7 + 1;
        } while (((bool)(bVar19 & uVar5 < 0x20)) && (iVar10 = iVar6 + 1, pbVar8 < pbVar4));
        uVar14 = 0;
        if (uVar5 != 0) {
          do {
            uVar11 = uVar11 - 1;
            b->bits_left = uVar11;
            uVar15 = 0;
            if (pbVar8 < pbVar4) {
              uVar15 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
            }
            if (uVar11 == 0) {
              pbVar8 = pbVar8 + 1;
              b->p = pbVar8;
              b->bits_left = 8;
              uVar11 = 8;
            }
            uVar14 = uVar14 | uVar15 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar5 = -1 << ((byte)uVar5 & 0x1f);
        uVar11 = ~uVar5 + uVar14;
        iVar10 = -((int)uVar11 >> 1);
        if ((uVar11 & 1) != 0) {
          iVar10 = (int)(uVar14 - uVar5) >> 1;
        }
        (psVar1->pwt).luma_weight_l0[lVar18] = iVar10;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.luma_weight_l0[ i ]: %d \n");
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar8 = b->p;
        pbVar4 = b->end;
        uVar11 = b->bits_left;
        iVar10 = -2;
        uVar5 = 0xffffffff;
        do {
          uVar7 = uVar5;
          iVar6 = iVar10;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar19 = true;
          if (pbVar8 < pbVar4) {
            bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar8 = pbVar8 + 1;
            b->p = pbVar8;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar5 = uVar7 + 1;
        } while (((bool)(bVar19 & uVar5 < 0x20)) && (iVar10 = iVar6 + 1, pbVar8 < pbVar4));
        uVar14 = 0;
        if (uVar5 != 0) {
          do {
            uVar11 = uVar11 - 1;
            b->bits_left = uVar11;
            uVar15 = 0;
            if (pbVar8 < pbVar4) {
              uVar15 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
            }
            if (uVar11 == 0) {
              pbVar8 = pbVar8 + 1;
              b->p = pbVar8;
              b->bits_left = 8;
              uVar11 = 8;
            }
            uVar14 = uVar14 | uVar15 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar11 = -1 << ((byte)uVar5 & 0x1f);
        uVar5 = ~uVar11 + uVar14;
        iVar10 = -((int)uVar5 >> 1);
        if ((uVar5 & 1) != 0) {
          iVar10 = (int)(uVar14 - uVar11) >> 1;
        }
        (psVar1->pwt).luma_offset_l0[lVar18] = iVar10;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.luma_offset_l0[ i ]: %d \n");
      }
      if (psVar2->chroma_format_idc != 0) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        uVar16 = 0;
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar11 = b->bits_left - 1;
        b->bits_left = uVar11;
        pbVar8 = b->p;
        if (pbVar8 < b->end) {
          uVar16 = (ulong)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
        }
        if (uVar11 == 0) {
          b->p = pbVar8 + 1;
          b->bits_left = 8;
        }
        (psVar1->pwt).chroma_weight_l0_flag[lVar18] = (int)uVar16;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.chroma_weight_l0_flag[i]: %d \n",uVar16);
        if ((psVar1->pwt).chroma_weight_l0_flag[lVar18] != 0) {
          lVar17 = 0;
          bVar19 = true;
          do {
            bVar9 = bVar19;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            pbVar8 = b->p;
            pbVar4 = b->end;
            uVar11 = b->bits_left;
            uVar5 = 0xffffffff;
            iVar10 = -2;
            do {
              iVar6 = iVar10;
              uVar7 = uVar5;
              uVar11 = uVar11 - 1;
              b->bits_left = uVar11;
              bVar19 = true;
              if (pbVar8 < pbVar4) {
                bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
              }
              if (uVar11 == 0) {
                pbVar8 = pbVar8 + 1;
                b->p = pbVar8;
                b->bits_left = 8;
                uVar11 = 8;
              }
              uVar5 = uVar7 + 1;
            } while (((bool)(bVar19 & uVar5 < 0x20)) && (iVar10 = iVar6 + 1, pbVar8 < pbVar4));
            uVar14 = 0;
            if (uVar5 != 0) {
              do {
                uVar11 = uVar11 - 1;
                b->bits_left = uVar11;
                uVar15 = 0;
                if (pbVar8 < pbVar4) {
                  uVar15 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
                }
                if (uVar11 == 0) {
                  pbVar8 = pbVar8 + 1;
                  b->p = pbVar8;
                  b->bits_left = 8;
                  uVar11 = 8;
                }
                uVar14 = uVar14 | uVar15 << ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 - 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != -2);
            }
            uVar5 = -1 << ((byte)uVar5 & 0x1f);
            uVar11 = ~uVar5 + uVar14;
            iVar10 = -((int)uVar11 >> 1);
            if ((uVar11 & 1) != 0) {
              iVar10 = (int)(uVar14 - uVar5) >> 1;
            }
            (psVar1->pwt).chroma_weight_l0[lVar18][lVar17] = iVar10;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"sh->pwt.chroma_weight_l0[ i ][ j ]: %d \n");
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            pbVar8 = b->p;
            pbVar4 = b->end;
            uVar11 = b->bits_left;
            iVar10 = -2;
            uVar5 = 0xffffffff;
            do {
              uVar7 = uVar5;
              iVar6 = iVar10;
              uVar11 = uVar11 - 1;
              b->bits_left = uVar11;
              bVar19 = true;
              if (pbVar8 < pbVar4) {
                bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
              }
              if (uVar11 == 0) {
                pbVar8 = pbVar8 + 1;
                b->p = pbVar8;
                b->bits_left = 8;
                uVar11 = 8;
              }
              uVar5 = uVar7 + 1;
            } while (((bool)(bVar19 & uVar5 < 0x20)) && (iVar10 = iVar6 + 1, pbVar8 < pbVar4));
            uVar14 = 0;
            if (uVar5 != 0) {
              do {
                uVar11 = uVar11 - 1;
                b->bits_left = uVar11;
                uVar15 = 0;
                if (pbVar8 < pbVar4) {
                  uVar15 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
                }
                if (uVar11 == 0) {
                  pbVar8 = pbVar8 + 1;
                  b->p = pbVar8;
                  b->bits_left = 8;
                  uVar11 = 8;
                }
                uVar14 = uVar14 | uVar15 << ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 - 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != -2);
            }
            uVar11 = -1 << ((byte)uVar5 & 0x1f);
            uVar5 = ~uVar11 + uVar14;
            iVar10 = -((int)uVar5 >> 1);
            if ((uVar5 & 1) != 0) {
              iVar10 = (int)(uVar14 - uVar11) >> 1;
            }
            (psVar1->pwt).chroma_offset_l0[lVar18][lVar17] = iVar10;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"sh->pwt.chroma_offset_l0[ i ][ j ]: %d \n");
            lVar17 = 1;
            bVar19 = false;
          } while (bVar9);
        }
      }
      bVar19 = lVar18 < ppVar3->num_ref_idx_l0_active_minus1;
      lVar18 = lVar18 + 1;
    } while (bVar19);
  }
  iVar10 = psVar1->slice_type;
  iVar6 = iVar10 + -5;
  if (iVar10 < 5) {
    iVar6 = iVar10;
  }
  if ((iVar6 == 1) && (-1 < ppVar3->num_ref_idx_l1_active_minus1)) {
    lVar18 = 0;
    do {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      uVar16 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar11 = b->bits_left - 1;
      b->bits_left = uVar11;
      pbVar8 = b->p;
      if (pbVar8 < b->end) {
        uVar16 = (ulong)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (uVar11 == 0) {
        b->p = pbVar8 + 1;
        b->bits_left = 8;
      }
      (psVar1->pwt).luma_weight_l1_flag[lVar18] = (int)uVar16;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->pwt.luma_weight_l1_flag[i]: %d \n",uVar16);
      if ((psVar1->pwt).luma_weight_l1_flag[lVar18] != 0) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar8 = b->p;
        pbVar4 = b->end;
        uVar11 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar10 = -2;
        do {
          iVar6 = iVar10;
          uVar7 = uVar5;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar19 = true;
          if (pbVar8 < pbVar4) {
            bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar8 = pbVar8 + 1;
            b->p = pbVar8;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar5 = uVar7 + 1;
        } while (((bool)(bVar19 & uVar5 < 0x20)) && (iVar10 = iVar6 + 1, pbVar8 < pbVar4));
        uVar14 = 0;
        if (uVar5 != 0) {
          do {
            uVar11 = uVar11 - 1;
            b->bits_left = uVar11;
            uVar15 = 0;
            if (pbVar8 < pbVar4) {
              uVar15 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
            }
            if (uVar11 == 0) {
              pbVar8 = pbVar8 + 1;
              b->p = pbVar8;
              b->bits_left = 8;
              uVar11 = 8;
            }
            uVar14 = uVar14 | uVar15 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar5 = -1 << ((byte)uVar5 & 0x1f);
        uVar11 = ~uVar5 + uVar14;
        iVar10 = -((int)uVar11 >> 1);
        if ((uVar11 & 1) != 0) {
          iVar10 = (int)(uVar14 - uVar5) >> 1;
        }
        (psVar1->pwt).luma_weight_l1[lVar18] = iVar10;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.luma_weight_l1[ i ]: %d \n");
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar8 = b->p;
        pbVar4 = b->end;
        uVar11 = b->bits_left;
        uVar5 = 0xffffffff;
        iVar10 = -2;
        do {
          iVar6 = iVar10;
          uVar7 = uVar5;
          uVar11 = uVar11 - 1;
          b->bits_left = uVar11;
          bVar19 = true;
          if (pbVar8 < pbVar4) {
            bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
          }
          if (uVar11 == 0) {
            pbVar8 = pbVar8 + 1;
            b->p = pbVar8;
            b->bits_left = 8;
            uVar11 = 8;
          }
          uVar5 = uVar7 + 1;
        } while (((bool)(bVar19 & uVar5 < 0x20)) && (iVar10 = iVar6 + 1, pbVar8 < pbVar4));
        uVar14 = 0;
        if (uVar5 != 0) {
          do {
            uVar11 = uVar11 - 1;
            b->bits_left = uVar11;
            uVar15 = 0;
            if (pbVar8 < pbVar4) {
              uVar15 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
            }
            if (uVar11 == 0) {
              pbVar8 = pbVar8 + 1;
              b->p = pbVar8;
              b->bits_left = 8;
              uVar11 = 8;
            }
            uVar14 = uVar14 | uVar15 << ((byte)uVar7 & 0x1f);
            uVar7 = uVar7 - 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != -2);
        }
        uVar11 = -1 << ((byte)uVar5 & 0x1f);
        uVar5 = ~uVar11 + uVar14;
        iVar10 = -((int)uVar5 >> 1);
        if ((uVar5 & 1) != 0) {
          iVar10 = (int)(uVar14 - uVar11) >> 1;
        }
        (psVar1->pwt).luma_offset_l1[lVar18] = iVar10;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.luma_offset_l1[ i ]: %d \n");
      }
      if (psVar2->chroma_format_idc != 0) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        uVar16 = 0;
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar11 = b->bits_left - 1;
        b->bits_left = uVar11;
        pbVar8 = b->p;
        if (pbVar8 < b->end) {
          uVar16 = (ulong)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
        }
        if (uVar11 == 0) {
          b->p = pbVar8 + 1;
          b->bits_left = 8;
        }
        (psVar1->pwt).chroma_weight_l1_flag[lVar18] = (int)uVar16;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.chroma_weight_l1_flag[i]: %d \n",uVar16);
        if ((psVar1->pwt).chroma_weight_l1_flag[lVar18] != 0) {
          lVar17 = 0;
          bVar19 = true;
          do {
            bVar9 = bVar19;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            pbVar8 = b->p;
            pbVar4 = b->end;
            uVar11 = b->bits_left;
            uVar5 = 0xffffffff;
            iVar10 = -2;
            do {
              iVar6 = iVar10;
              uVar7 = uVar5;
              uVar11 = uVar11 - 1;
              b->bits_left = uVar11;
              bVar19 = true;
              if (pbVar8 < pbVar4) {
                bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
              }
              if (uVar11 == 0) {
                pbVar8 = pbVar8 + 1;
                b->p = pbVar8;
                b->bits_left = 8;
                uVar11 = 8;
              }
              uVar5 = uVar7 + 1;
            } while (((bool)(bVar19 & uVar5 < 0x20)) && (iVar10 = iVar6 + 1, pbVar8 < pbVar4));
            uVar14 = 0;
            if (uVar5 != 0) {
              do {
                uVar11 = uVar11 - 1;
                b->bits_left = uVar11;
                uVar15 = 0;
                if (pbVar8 < pbVar4) {
                  uVar15 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
                }
                if (uVar11 == 0) {
                  pbVar8 = pbVar8 + 1;
                  b->p = pbVar8;
                  b->bits_left = 8;
                  uVar11 = 8;
                }
                uVar14 = uVar14 | uVar15 << ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 - 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != -2);
            }
            uVar5 = -1 << ((byte)uVar5 & 0x1f);
            uVar11 = ~uVar5 + uVar14;
            iVar10 = -((int)uVar11 >> 1);
            if ((uVar11 & 1) != 0) {
              iVar10 = (int)(uVar14 - uVar5) >> 1;
            }
            (psVar1->pwt).chroma_weight_l1[lVar18][lVar17] = iVar10;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"sh->pwt.chroma_weight_l1[ i ][ j ]: %d \n");
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            pbVar8 = b->p;
            pbVar4 = b->end;
            uVar11 = b->bits_left;
            uVar5 = 0xffffffff;
            iVar10 = -2;
            do {
              iVar6 = iVar10;
              uVar7 = uVar5;
              uVar11 = uVar11 - 1;
              b->bits_left = uVar11;
              bVar19 = true;
              if (pbVar8 < pbVar4) {
                bVar19 = (*pbVar8 >> (uVar11 & 0x1f) & 1) == 0;
              }
              if (uVar11 == 0) {
                pbVar8 = pbVar8 + 1;
                b->p = pbVar8;
                b->bits_left = 8;
                uVar11 = 8;
              }
              uVar5 = uVar7 + 1;
            } while (((bool)(bVar19 & uVar5 < 0x20)) && (iVar10 = iVar6 + 1, pbVar8 < pbVar4));
            uVar14 = 0;
            if (uVar5 != 0) {
              do {
                uVar11 = uVar11 - 1;
                b->bits_left = uVar11;
                uVar15 = 0;
                if (pbVar8 < pbVar4) {
                  uVar15 = (uint)((*pbVar8 >> (uVar11 & 0x1f) & 1) != 0);
                }
                if (uVar11 == 0) {
                  pbVar8 = pbVar8 + 1;
                  b->p = pbVar8;
                  b->bits_left = 8;
                  uVar11 = 8;
                }
                uVar14 = uVar14 | uVar15 << ((byte)uVar7 & 0x1f);
                uVar7 = uVar7 - 1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != -2);
            }
            uVar11 = -1 << ((byte)uVar5 & 0x1f);
            uVar5 = ~uVar11 + uVar14;
            iVar10 = -((int)uVar5 >> 1);
            if ((uVar5 & 1) != 0) {
              iVar10 = (int)(uVar14 - uVar11) >> 1;
            }
            (psVar1->pwt).chroma_offset_l1[lVar18][lVar17] = iVar10;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"sh->pwt.chroma_offset_l1[ i ][ j ]: %d \n");
            lVar17 = 1;
            bVar19 = false;
          } while (bVar9);
        }
      }
      bVar19 = lVar18 < ppVar3->num_ref_idx_l1_active_minus1;
      lVar18 = lVar18 + 1;
    } while (bVar19);
  }
  return;
}

Assistant:

void read_debug_pred_weight_table(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    sps_t* sps = h->sps;
    pps_t* pps = h->pps;

    int i, j;

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_log2_weight_denom = bs_read_ue(b); printf("sh->pwt.luma_log2_weight_denom: %d \n", sh->pwt.luma_log2_weight_denom); 
    if( sps->chroma_format_idc != 0 ) //FIXME ChromaArrayType may differ from chroma_format_idc
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_log2_weight_denom = bs_read_ue(b); printf("sh->pwt.chroma_log2_weight_denom: %d \n", sh->pwt.chroma_log2_weight_denom); 
    }
    for( i = 0; i <= pps->num_ref_idx_l0_active_minus1; i++ )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l0_flag[i] = bs_read_u1(b); printf("sh->pwt.luma_weight_l0_flag[i]: %d \n", sh->pwt.luma_weight_l0_flag[i]); 
        if( sh->pwt.luma_weight_l0_flag[i] )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l0[ i ] = bs_read_se(b); printf("sh->pwt.luma_weight_l0[ i ]: %d \n", sh->pwt.luma_weight_l0[ i ]); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_offset_l0[ i ] = bs_read_se(b); printf("sh->pwt.luma_offset_l0[ i ]: %d \n", sh->pwt.luma_offset_l0[ i ]); 
        }
        if ( sps->chroma_format_idc != 0 ) //FIXME ChromaArrayType may differ from chroma_format_idc
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l0_flag[i] = bs_read_u1(b); printf("sh->pwt.chroma_weight_l0_flag[i]: %d \n", sh->pwt.chroma_weight_l0_flag[i]); 
            if( sh->pwt.chroma_weight_l0_flag[i] )
            {
                for( j =0; j < 2; j++ )
                {
                    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l0[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_weight_l0[ i ][ j ]: %d \n", sh->pwt.chroma_weight_l0[ i ][ j ]); 
                    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_offset_l0[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_offset_l0[ i ][ j ]: %d \n", sh->pwt.chroma_offset_l0[ i ][ j ]); 
                }
            }
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        for( i = 0; i <= pps->num_ref_idx_l1_active_minus1; i++ )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l1_flag[i] = bs_read_u1(b); printf("sh->pwt.luma_weight_l1_flag[i]: %d \n", sh->pwt.luma_weight_l1_flag[i]); 
            if( sh->pwt.luma_weight_l1_flag[i] )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l1[ i ] = bs_read_se(b); printf("sh->pwt.luma_weight_l1[ i ]: %d \n", sh->pwt.luma_weight_l1[ i ]); 
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_offset_l1[ i ] = bs_read_se(b); printf("sh->pwt.luma_offset_l1[ i ]: %d \n", sh->pwt.luma_offset_l1[ i ]); 
            }
            if( sps->chroma_format_idc != 0 )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l1_flag[i] = bs_read_u1(b); printf("sh->pwt.chroma_weight_l1_flag[i]: %d \n", sh->pwt.chroma_weight_l1_flag[i]); 
                if( sh->pwt.chroma_weight_l1_flag[i] )
                {
                    for( j = 0; j < 2; j++ )
                    {
                        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l1[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_weight_l1[ i ][ j ]: %d \n", sh->pwt.chroma_weight_l1[ i ][ j ]); 
                        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_offset_l1[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_offset_l1[ i ][ j ]: %d \n", sh->pwt.chroma_offset_l1[ i ][ j ]); 
                    }
                }
            }
        }
    }
}